

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleBenchmark.cpp
# Opt level: O3

int * beagle::benchmark::getRandomTipStates(int nsites,int stateCount,uint *seed)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  
  piVar1 = (int *)calloc(4,(long)nsites);
  if (0 < nsites) {
    uVar2 = *seed;
    uVar3 = 0;
    do {
      uVar2 = uVar2 * 0x41c64e6d + 0x3039;
      piVar1[uVar3] = (int)((long)(ulong)(uVar2 & 0x7fffffff) % (long)stateCount);
      uVar3 = uVar3 + 1;
    } while ((uint)nsites != uVar3);
    *seed = uVar2;
  }
  return piVar1;
}

Assistant:

int* getRandomTipStates( int nsites, int stateCount, unsigned int *seed )
{
    int *states = (int*) calloc(sizeof(int), nsites);
    for( int i=0; i<nsites; i++ )
    {
        int s = gt_rand(seed)%stateCount;
        states[i]=s;
    }
    return states;
}